

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurface.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChSurface::ArchiveOUT(ChSurface *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::geometry::ChSurface>(marchive);
  ChGeometry::ArchiveOUT(&this->super_ChGeometry,marchive);
  return;
}

Assistant:

void ChSurface::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSurface>();
    // serialize parent class
    ChGeometry::ArchiveOUT(marchive);
    // serialize all member data:
    // marchive << CHNVP(closed);
}